

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InsideExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InsideExpressionSyntax,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::RangeListSyntax&>
          (BumpAllocator *this,ExpressionSyntax *args,Token *args_1,RangeListSyntax *args_2)

{
  Token inside;
  InsideExpressionSyntax *pIVar1;
  RangeListSyntax *in_RCX;
  BumpAllocator *in_RDX;
  InsideExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pIVar1 = (InsideExpressionSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8);
  inside.info = unaff_retaddr;
  inside.kind = (short)in_RDI;
  inside._2_1_ = (char)((ulong)in_RDI >> 0x10);
  inside.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  inside.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::InsideExpressionSyntax::InsideExpressionSyntax
            (in_RSI,(ExpressionSyntax *)in_RDX,inside,in_RCX);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }